

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_894271::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  allocator<cmListFileArgument> *this;
  pointer *this_00;
  initializer_list<cmListFileArgument> __l;
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  char *local_570;
  cmListFileArgument *local_500;
  char *local_4d0;
  char *local_488;
  cmAlphaNum local_480;
  cmAlphaNum local_450;
  string local_420;
  cmAlphaNum local_400;
  cmAlphaNum local_3d0;
  string local_3a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  undefined1 local_358 [8];
  cmExecutionStatus status;
  string local_2f8;
  undefined1 local_2d8 [8];
  cmListFileFunction newLFF;
  string local_2c0;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  string local_258;
  string local_238;
  cmListFileArgument *local_218;
  cmListFileArgument local_210;
  cmListFileArgument local_1e0;
  cmListFileArgument cStack_1b0;
  cmListFileArgument local_180;
  cmListFileArgument local_150;
  iterator local_120;
  size_type local_118;
  undefined1 local_110 [8];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  long fakeLineNo;
  string local_e8;
  cmValue local_c8;
  cmValue currentListFile;
  allocator<char> local_a9;
  string local_a8;
  cmValue local_88;
  string local_80 [8];
  string stack;
  cmMakefile *makefile;
  string accessString;
  cmVariableWatchCallbackData *data;
  cmMakefile *mf_local;
  char *newValue_local;
  void *client_data_local;
  int access_type_local;
  string *variable_local;
  
  if ((*client_data & 1) == 0) {
    *(undefined1 *)client_data = 1;
    accessString.field_2._8_8_ = client_data;
    psVar3 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    std::__cxx11::string::string((string *)&makefile,(string *)psVar3);
    stack.field_2._8_8_ = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"LISTFILE_STACK",&local_a9);
    local_88 = cmMakefile::GetProperty(mf,&local_a8);
    psVar3 = cmValue::operator*[abi_cxx11_(&local_88);
    std::__cxx11::string::string(local_80,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    uVar4 = std::__cxx11::string::empty();
    uVar1 = stack.field_2._8_8_;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"CMAKE_CURRENT_LIST_FILE",
                 (allocator<char> *)((long)&fakeLineNo + 7));
      local_c8 = cmMakefile::GetDefinition(mf,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&fakeLineNo + 7));
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x7fffffffffffffff;
      newLFF.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
      local_218 = &local_210;
      std::__cxx11::string::string((string *)&local_238,(string *)variable);
      cmListFileArgument::cmListFileArgument(&local_210,&local_238,Quoted,0x7fffffffffffffff);
      local_218 = &local_1e0;
      std::__cxx11::string::string((string *)&local_258,(string *)&makefile);
      cmListFileArgument::cmListFileArgument(&local_1e0,&local_258,Quoted,0x7fffffffffffffff);
      local_4d0 = newValue;
      if (newValue == (char *)0x0) {
        local_4d0 = "";
      }
      local_218 = &cStack_1b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,local_4d0,&local_279);
      cmListFileArgument::cmListFileArgument(&cStack_1b0,&local_278,Quoted,0x7fffffffffffffff);
      local_218 = &local_180;
      psVar3 = cmValue::operator*[abi_cxx11_(&local_c8);
      std::__cxx11::string::string((string *)&local_2a0,(string *)psVar3);
      cmListFileArgument::cmListFileArgument(&local_180,&local_2a0,Quoted,0x7fffffffffffffff);
      local_218 = &local_150;
      std::__cxx11::string::string((string *)&local_2c0,local_80);
      cmListFileArgument::cmListFileArgument(&local_150,&local_2c0,Quoted,0x7fffffffffffffff);
      newLFF.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0;
      local_120 = &local_210;
      local_118 = 5;
      this = (allocator<cmListFileArgument> *)
             ((long)&newLFF.Impl.
                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 6);
      std::allocator<cmListFileArgument>::allocator(this);
      __l._M_len = local_118;
      __l._M_array = local_120;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_110,__l,
                 this);
      std::allocator<cmListFileArgument>::~allocator
                ((allocator<cmListFileArgument> *)
                 ((long)&newLFF.Impl.
                         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 6));
      local_500 = (cmListFileArgument *)&local_120;
      do {
        local_500 = local_500 + -1;
        cmListFileArgument::~cmListFileArgument(local_500);
      } while (local_500 != &local_210);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::string((string *)&local_2f8,(string *)(accessString.field_2._8_8_ + 8));
      this_00 = &status.Variables.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_110);
      cmListFileFunction::cmListFileFunction
                ((cmListFileFunction *)local_2d8,&local_2f8,0x7fffffffffffffff,0x7fffffffffffffff,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                 &status.Variables.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_2f8);
      cmExecutionStatus::cmExecutionStatus
                ((cmExecutionStatus *)local_358,(cmMakefile *)stack.field_2._8_8_);
      uVar1 = stack.field_2._8_8_;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_380);
      bVar2 = cmMakefile::ExecuteCommand
                        ((cmMakefile *)uVar1,(cmListFileFunction *)local_2d8,
                         (cmExecutionStatus *)local_358,&local_380);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_380);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        cmAlphaNum::cmAlphaNum
                  (&local_3d0,
                   "Error in cmake code at\nUnknown:0:\nA command failed during the invocation of callback \""
                  );
        cmAlphaNum::cmAlphaNum(&local_400,(string *)(accessString.field_2._8_8_ + 8));
        cmStrCat<char[3]>(&local_3a0,&local_3d0,&local_400,(char (*) [3])0xc51e52);
        cmSystemTools::Error(&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
      }
      cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_358);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_2d8);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_110);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_450,"Variable \"");
      cmAlphaNum::cmAlphaNum(&local_480,variable);
      local_570 = newValue;
      if (newValue == (char *)0x0) {
        local_570 = "";
      }
      local_488 = local_570;
      cmStrCat<char[22],std::__cxx11::string,char[14],char_const*,char[3]>
                (&local_420,&local_450,&local_480,(char (*) [22])"\" was accessed using ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&makefile,
                 (char (*) [14])" with value \"",&local_488,(char (*) [3])0xc51e52);
      cmMakefile::IssueMessage((cmMakefile *)uVar1,LOG,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
    }
    *(undefined1 *)accessString.field_2._8_8_ = 0;
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)&makefile);
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}